

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O1

void mpack_store_float(char *p,float value)

{
  *(uint *)p = (uint)value >> 0x18 | ((uint)value & 0xff0000) >> 8 | ((uint)value & 0xff00) << 8 |
               (int)value << 0x18;
  return;
}

Assistant:

MPACK_INLINE void mpack_store_float(char* p, float value) {
    MPACK_CHECK_FLOAT_ORDER();
    union {
        float f;
        uint32_t u;
    } v;
    v.f = value;
    mpack_store_u32(p, v.u);
}